

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

Expression * __thiscall slang::ast::Compilation::getDefaultDisable(Compilation *this,Scope *scope)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  ulong uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  int iVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  value_type *elements;
  ulong uVar11;
  uint uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  undefined1 auVar17 [16];
  
  uVar3 = (this->defaultDisableMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
          .arrays.groups_size_mask;
  pgVar4 = (this->defaultDisableMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
           .arrays.groups_;
  ppVar5 = (this->defaultDisableMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
           .arrays.elements_;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = scope;
    uVar10 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar8 = uVar10 >> ((byte)(this->defaultDisableMap).table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
                             .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar10 & 0xff];
    uVar11 = 0;
    do {
      pgVar1 = pgVar4 + uVar8;
      uVar13 = (uchar)uVar2;
      auVar17[0] = -(pgVar1->m[0].n == uVar13);
      uVar14 = (uchar)((uint)uVar2 >> 8);
      auVar17[1] = -(pgVar1->m[1].n == uVar14);
      uVar15 = (uchar)((uint)uVar2 >> 0x10);
      auVar17[2] = -(pgVar1->m[2].n == uVar15);
      uVar16 = (uchar)((uint)uVar2 >> 0x18);
      auVar17[3] = -(pgVar1->m[3].n == uVar16);
      auVar17[4] = -(pgVar1->m[4].n == uVar13);
      auVar17[5] = -(pgVar1->m[5].n == uVar14);
      auVar17[6] = -(pgVar1->m[6].n == uVar15);
      auVar17[7] = -(pgVar1->m[7].n == uVar16);
      auVar17[8] = -(pgVar1->m[8].n == uVar13);
      auVar17[9] = -(pgVar1->m[9].n == uVar14);
      auVar17[10] = -(pgVar1->m[10].n == uVar15);
      auVar17[0xb] = -(pgVar1->m[0xb].n == uVar16);
      auVar17[0xc] = -(pgVar1->m[0xc].n == uVar13);
      auVar17[0xd] = -(pgVar1->m[0xd].n == uVar14);
      auVar17[0xe] = -(pgVar1->m[0xe].n == uVar15);
      auVar17[0xf] = -(pgVar1->m[0xf].n == uVar16);
      for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
          uVar12 = uVar12 - 1 & uVar12) {
        iVar6 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        if (scope == *(Scope **)((long)&ppVar5[uVar8 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
          lVar9 = (long)&ppVar5[uVar8 * 0xf].first + (ulong)(uint)(iVar6 << 4);
          goto LAB_0014aefc;
        }
      }
      if ((pgVar4[uVar8].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7]) == 0) break;
      lVar9 = uVar8 + uVar11;
      uVar11 = uVar11 + 1;
      uVar8 = lVar9 + 1U & uVar3;
    } while (uVar11 <= uVar3);
    lVar9 = 0;
LAB_0014aefc:
    if (lVar9 != 0) {
      return *(Expression **)(lVar9 + 8);
    }
    scope = scope->thisSym->parentScope;
    if ((scope == (Scope *)0x0) || (scope->thisSym->kind == CompilationUnit)) {
      return (Expression *)0x0;
    }
  } while( true );
}

Assistant:

const Expression* Compilation::getDefaultDisable(const Scope& scope) const {
    auto curr = &scope;
    while (true) {
        if (auto it = defaultDisableMap.find(curr); it != defaultDisableMap.end())
            return it->second;

        curr = curr->asSymbol().getParentScope();
        if (!curr || curr->asSymbol().kind == SymbolKind::CompilationUnit)
            return nullptr;
    }
}